

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O0

void Js::ByteCodeDumper::
     DumpElementC<Js::OpLayoutT_ElementC<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
               (OpCode op,OpLayoutT_ElementC<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  PropertyId propertyId;
  ScriptContext *this;
  PropertyRecord *this_00;
  char16 *pcVar4;
  undefined4 *puVar5;
  PropertyRecord *pPropertyName;
  ScriptContext *scriptContext;
  ByteCodeReader *reader_local;
  FunctionBody *dumpFunction_local;
  OpLayoutT_ElementC<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *data_local;
  OpCode op_local;
  
  this = FunctionProxy::GetScriptContext((FunctionProxy *)dumpFunction);
  propertyId = FunctionBody::GetReferencedPropertyId(dumpFunction,(uint)data->PropertyIdIndex);
  this_00 = ScriptContext::GetPropertyName(this,propertyId);
  if ((ushort)(op - DeleteFld) < 4) {
LAB_00b1fc15:
    bVar1 = data->Instance;
    pcVar4 = PropertyRecord::GetBuffer(this_00);
    Output::Print(L" R%d.%s",(ulong)bVar1,pcVar4);
  }
  else {
    if (op == StFuncExpr) {
LAB_00b1fc76:
      bVar1 = data->Instance;
      pcVar4 = PropertyRecord::GetBuffer(this_00);
      Output::Print(L" R%d.%s = R%d",(ulong)bVar1,pcVar4,(ulong)data->Value);
      return;
    }
    if (1 < (ushort)(op - InitClassMemberSet)) {
      if (op == DeleteFld_ReuseLoc) goto LAB_00b1fc15;
      if (1 < (ushort)(op - InitSetFld)) {
        if (op != InitProto) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                      ,0x2d4,"(false)","Unknown OpCode for OpLayoutElementC");
          if (bVar3) {
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 0;
            return;
          }
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        goto LAB_00b1fc76;
      }
    }
    bVar1 = data->Instance;
    pcVar4 = PropertyRecord::GetBuffer(this_00);
    Output::Print(L" R%d.%s = (Set/Get) R%d",(ulong)bVar1,pcVar4,(ulong)data->Value);
  }
  return;
}

Assistant:

void ByteCodeDumper::DumpElementC(OpCode op, const unaligned T * data, Js::FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        ScriptContext* scriptContext = dumpFunction->GetScriptContext();
        PropertyRecord const * pPropertyName = scriptContext->GetPropertyName(
            dumpFunction->GetReferencedPropertyId(data->PropertyIdIndex));
        switch (op)
        {
            case OpCode::DeleteFld:
            case OpCode::DeleteFld_ReuseLoc:
            case OpCode::DeleteRootFld:
            case OpCode::DeleteFldStrict:
            case OpCode::DeleteRootFldStrict:
            {
                Output::Print(_u(" R%d.%s"), data->Instance, pPropertyName->GetBuffer());
                break;
            }
            case OpCode::InitSetFld:
            case OpCode::InitGetFld:
            case OpCode::InitClassMemberGet:
            case OpCode::InitClassMemberSet:
            {
                Output::Print(_u(" R%d.%s = (Set/Get) R%d"), data->Instance, pPropertyName->GetBuffer(),
                        data->Value);
                break;
            }
            case OpCode::StFuncExpr:
            case OpCode::InitProto:
            {
                Output::Print(_u(" R%d.%s = R%d"), data->Instance, pPropertyName->GetBuffer(),
                        data->Value);
                break;
            }
            default:
            {
                AssertMsg(false, "Unknown OpCode for OpLayoutElementC");
                break;
            }
        }
    }